

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_linear_resampler_interpolate_frame_f32(ma_linear_resampler *pResampler,float *pFrameOut)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  float s;
  float a;
  ma_uint32 c;
  float *pFrameOut_local;
  ma_linear_resampler *pResampler_local;
  float r1;
  float r0;
  
  if (pResampler == (ma_linear_resampler *)0x0) {
    __assert_fail("pResampler != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x7fa4,
                  "void ma_linear_resampler_interpolate_frame_f32(ma_linear_resampler *, float *)");
  }
  if (pFrameOut != (float *)0x0) {
    uVar2 = (pResampler->config).sampleRateOut;
    uVar3 = pResampler->inTimeFrac;
    for (s = 0.0; (uint)s < (pResampler->config).channels; s = (float)((int)s + 1)) {
      fVar1 = *(float *)((long)&pResampler->x0 + (ulong)(uint)s * 4);
      pFrameOut[(uint)s] =
           fVar1 + (*(float *)((long)&pResampler->x1 + (ulong)(uint)s * 4) - fVar1) *
                   ((float)uVar3 / (float)uVar2);
    }
    return;
  }
  __assert_fail("pFrameOut != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x7fa5,
                "void ma_linear_resampler_interpolate_frame_f32(ma_linear_resampler *, float *)");
}

Assistant:

static void ma_linear_resampler_interpolate_frame_f32(ma_linear_resampler* pResampler, float* pFrameOut)
{
    ma_uint32 c;
    float a;

    MA_ASSERT(pResampler != NULL);
    MA_ASSERT(pFrameOut  != NULL);

    a = (float)pResampler->inTimeFrac / pResampler->config.sampleRateOut;

    for (c = 0; c < pResampler->config.channels; c += 1) {
        float s = ma_mix_f32_fast(pResampler->x0.f32[c], pResampler->x1.f32[c], a);
        pFrameOut[c] = s;
    }
}